

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

string * __thiscall
helics::CloneFilterOperation::getString_abi_cxx11_(CloneFilterOperation *this,string_view property)

{
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar3;
  iterator this_01;
  iterator __rhs;
  char *in_RSI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *address;
  iterator __end2;
  iterator __begin2;
  handle *__range2;
  handle handle;
  string *results;
  shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff38;
  undefined7 uVar4;
  undefined1 in_stack_ffffffffffffff3f;
  char __c;
  string *psVar5;
  size_t in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_88;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  *local_80;
  allocator<char> local_76;
  undefined1 local_75;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  undefined4 local_5c;
  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
  local_58 [3];
  
  psVar5 = in_RDI;
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  __x._M_str = (char *)in_stack_ffffffffffffff60;
  __x._M_len = in_stack_ffffffffffffff58;
  __y._M_str = in_RSI;
  __y._M_len = (size_t)psVar5;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
    gmlc::libguarded::
    shared_guarded<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff28);
    gmlc::libguarded::
    lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::operator->(local_58);
    bVar2 = CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_RDI);
    if (bVar2) {
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    }
    else {
      this_00 = gmlc::libguarded::
                lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                ::operator->(local_58);
      sVar3 = CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00);
      if (sVar3 == 1) {
        gmlc::libguarded::
        lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
        ::operator->(local_58);
        local_68._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CLI::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffff28);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_68);
        std::__cxx11::string::string(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      else {
        local_75 = 0;
        uVar4 = SUB87(&local_76,0);
        __c = (char)((ulong)&local_76 >> 0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff60);
        std::allocator<char>::~allocator(&local_76);
        local_80 = local_58;
        this_01 = gmlc::libguarded::
                  lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                  ::begin((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                           *)in_stack_ffffffffffffff28);
        local_88._M_current = this_01._M_current;
        __rhs = gmlc::libguarded::
                lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                ::end((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                       *)in_stack_ffffffffffffff28);
        while (bVar2 = __gnu_cxx::
                       operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)this_01._M_current,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)__rhs._M_current), ((bVar2 ^ 0xffU) & 1) != 0) {
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&local_88);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__c)
          ;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(__c,uVar4));
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__c)
          ;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__c)
          ;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_88);
        }
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        pop_back(this_01._M_current);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,__c);
        local_75 = 1;
      }
    }
    local_5c = 1;
    gmlc::libguarded::
    lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
    ::~lock_handle((lock_handle<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
                    *)0x3aa467);
  }
  else {
    sVar1._M_str._0_7_ = in_stack_ffffffffffffff38;
    sVar1._M_len = in_stack_ffffffffffffff30;
    sVar1._M_str._7_1_ = in_stack_ffffffffffffff3f;
    FilterOperations::getString_abi_cxx11_((FilterOperations *)in_stack_ffffffffffffff28,sVar1);
  }
  return psVar5;
}

Assistant:

std::string CloneFilterOperation::getString(std::string_view property)
{
    if (property == "delivery") {
        auto handle = deliveryAddresses.lock();
        if (handle->empty()) {
            return {};
        }
        if (handle->size() == 1) {
            return *(handle->begin());
        }
        std::string results{"["};
        for (auto& address : handle) {
            results.push_back('"');
            results.append(address);
            results.push_back('"');
            results.push_back(',');
        }
        results.pop_back();
        results.push_back(']');
        return results;
    }
    return FilterOperations::getString(property);
}